

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::alphaProductPlusY
          (HighsSparseMatrix *this,double alpha,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y,bool transpose)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->format_ == kColwise) {
    uVar10 = 0;
    if (0 < this->num_col_) {
      uVar10 = (ulong)(uint)this->num_col_;
    }
    if (transpose) {
      uVar8 = 0;
      while (uVar9 = uVar8, uVar9 != uVar10) {
        iVar1 = piVar3[uVar9 + 1];
        piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar11 = (long)piVar3[uVar9]; uVar8 = uVar9 + 1, lVar11 < iVar1; lVar11 = lVar11 + 1) {
          pdVar7[uVar9] = pdVar5[lVar11] * alpha * pdVar6[piVar4[lVar11]] + pdVar7[uVar9];
        }
      }
    }
    else {
      uVar8 = 0;
      while (uVar9 = uVar8, uVar9 != uVar10) {
        iVar1 = piVar3[uVar9 + 1];
        piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar11 = (long)piVar3[uVar9]; uVar8 = uVar9 + 1, lVar11 < iVar1; lVar11 = lVar11 + 1) {
          iVar2 = piVar4[lVar11];
          pdVar7[iVar2] = pdVar5[lVar11] * alpha * pdVar6[uVar9] + pdVar7[iVar2];
        }
      }
    }
  }
  else {
    uVar10 = 0;
    if (0 < this->num_row_) {
      uVar10 = (ulong)(uint)this->num_row_;
    }
    if (transpose) {
      uVar8 = 0;
      while (uVar9 = uVar8, uVar9 != uVar10) {
        iVar1 = piVar3[uVar9 + 1];
        piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar11 = (long)piVar3[uVar9]; uVar8 = uVar9 + 1, lVar11 < iVar1; lVar11 = lVar11 + 1) {
          iVar2 = piVar4[lVar11];
          pdVar7[iVar2] = pdVar5[lVar11] * alpha * pdVar6[uVar9] + pdVar7[iVar2];
        }
      }
    }
    else {
      uVar8 = 0;
      while (uVar9 = uVar8, uVar9 != uVar10) {
        iVar1 = piVar3[uVar9 + 1];
        piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar11 = (long)piVar3[uVar9]; uVar8 = uVar9 + 1, lVar11 < iVar1; lVar11 = lVar11 + 1) {
          pdVar7[uVar9] = pdVar5[lVar11] * alpha * pdVar6[piVar4[lVar11]] + pdVar7[uVar9];
        }
      }
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}